

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weak_ptr_ipp.hpp
# Opt level: O3

shared_ptr<duckdb::CheckpointLock,_true> __thiscall
duckdb::weak_ptr<duckdb::CheckpointLock,_true>::lock(weak_ptr<duckdb::CheckpointLock,_true> *this)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Atomic_word _Var2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *in_RSI;
  bool bVar4;
  shared_ptr<duckdb::CheckpointLock,_true> sVar5;
  
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[1];
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_017e9308:
    (this->internal).super___weak_ptr<duckdb::CheckpointLock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->internal).super___weak_ptr<duckdb::CheckpointLock,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    _Var2 = this_00->_M_use_count;
    do {
      if (_Var2 == 0) goto LAB_017e9308;
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar4 = _Var2 == iVar1;
      if (bVar4) {
        this_00->_M_use_count = _Var2 + 1;
        iVar1 = _Var2;
      }
      _Var2 = iVar1;
      UNLOCK();
    } while (!bVar4);
    iVar1 = this_00->_M_use_count;
    if (iVar1 == 0) {
      peVar3 = (element_type *)0x0;
    }
    else {
      peVar3 = (element_type *)*in_RSI;
    }
    (this->internal).super___weak_ptr<duckdb::CheckpointLock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar3;
    (this->internal).super___weak_ptr<duckdb::CheckpointLock,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = this_00;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = iVar1 + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    in_RDX._M_pi = extraout_RDX;
  }
  sVar5.internal.super___shared_ptr<duckdb::CheckpointLock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = in_RDX._M_pi;
  sVar5.internal.super___shared_ptr<duckdb::CheckpointLock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::CheckpointLock,_true>)
         sVar5.internal.super___shared_ptr<duckdb::CheckpointLock,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<T, SAFE> lock() const { // NOLINT: invalid case style
		return shared_ptr<T, SAFE>(internal.lock());
	}